

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareAttributes
          (TextureTestBase *this,GLuint test_case_index,ProgramInterface *program_interface,
          Buffer *buffer,VertexArray *vao)

{
  GLuint GVar1;
  pointer ppVVar2;
  Variable *pVVar3;
  pointer data;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Type local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  
  iVar4 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0x1f]
          )();
  Utils::VertexArray::Bind(vao);
  Utils::Buffer::Bind(buffer);
  ppVVar2 = (program_interface->m_vertex).m_inputs.
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(program_interface->m_vertex).m_inputs.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2;
  if (lVar5 != 0) {
    uVar6 = 0;
    for (uVar7 = 0; (ulong)uVar7 < (ulong)(lVar5 >> 3); uVar7 = uVar7 + 1) {
      pVVar3 = ppVVar2[uVar7];
      uVar8 = (pVVar3->m_descriptor).m_offset + (int)pVVar3->m_data_size;
      if ((int)uVar6 <= (int)uVar8) {
        uVar6 = uVar8;
      }
    }
    buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer_data,(ulong)uVar6);
    data = buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    uVar7 = 0;
    while( true ) {
      ppVVar2 = (program_interface->m_vertex).m_inputs.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(program_interface->m_vertex).m_inputs.
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3) <=
          (ulong)uVar7) break;
      pVVar3 = ppVVar2[uVar7];
      memcpy(data + (pVVar3->m_descriptor).m_offset,pVVar3->m_data,pVVar3->m_data_size);
      if ((char)iVar4 == '\0') {
        GVar1 = (pVVar3->m_descriptor).m_n_array_elements;
        Utils::VertexArray::Attribute
                  (vao,(pVVar3->m_descriptor).m_expected_location,
                   &(pVVar3->m_descriptor).field_9.m_builtin,GVar1,
                   (pVVar3->m_descriptor).m_normalized,
                   (GVar1 + (GVar1 == 0)) * (pVVar3->m_descriptor).m_expected_stride_of_element,
                   (GLvoid *)(ulong)(pVVar3->m_descriptor).m_offset);
      }
      else if ((pVVar3->m_descriptor).m_expected_component == 0) {
        local_58._0_8_ = (ulong)(pVVar3->m_descriptor).field_9.m_builtin.m_basic_type | 0x100000000;
        local_58.m_n_rows = 4;
        GVar1 = (pVVar3->m_descriptor).m_n_array_elements;
        Utils::VertexArray::Attribute
                  (vao,(pVVar3->m_descriptor).m_expected_location,&local_58,GVar1,
                   (pVVar3->m_descriptor).m_normalized,
                   (GVar1 + (GVar1 == 0)) * (pVVar3->m_descriptor).m_expected_stride_of_element,
                   (GLvoid *)(ulong)(pVVar3->m_descriptor).m_offset);
      }
      uVar7 = uVar7 + 1;
    }
    Utils::Buffer::Data(buffer,StaticDraw,(ulong)uVar6,data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void TextureTestBase::prepareAttributes(GLuint test_case_index, Utils::ProgramInterface& program_interface,
										Utils::Buffer& buffer, Utils::VertexArray& vao)
{
	bool use_component_qualifier = useComponentQualifier(test_case_index);

	/* Get shader interface */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Bind vao and buffer */
	vao.Bind();
	buffer.Bind();

	/* Skip if there are no input variables in vertex shader */
	if (0 == si.m_inputs.size())
	{
		return;
	}

	/* Calculate vertex stride and check */
	GLint vertex_stride = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		GLint variable_size = static_cast<GLuint>(variable.m_data_size);

		GLint ends_at = variable_size + variable.m_descriptor.m_offset;

		vertex_stride = std::max(vertex_stride, ends_at);
	}

	/* Prepare buffer data and set up vao */
	std::vector<GLubyte> buffer_data;
	buffer_data.resize(vertex_stride);

	GLubyte* ptr = &buffer_data[0];

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		memcpy(ptr + variable.m_descriptor.m_offset, variable.m_data, variable.m_data_size);

		if (false == use_component_qualifier)
		{
			vao.Attribute(variable.m_descriptor.m_expected_location, variable.m_descriptor.m_builtin,
						  variable.m_descriptor.m_n_array_elements, variable.m_descriptor.m_normalized,
						  variable.GetStride(), (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
		else if (0 == variable.m_descriptor.m_expected_component)
		{
			/* Components can only be applied to vectors.
			 Assumption that test use all 4 components */
			const Utils::Type& type =
				Utils::Type::GetType(variable.m_descriptor.m_builtin.m_basic_type, 1 /* n_columns */, 4 /* n_rows */);

			vao.Attribute(variable.m_descriptor.m_expected_location, type, variable.m_descriptor.m_n_array_elements,
						  variable.m_descriptor.m_normalized, variable.GetStride(),
						  (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
	}

	/* Update buffer */
	buffer.Data(Utils::Buffer::StaticDraw, vertex_stride, ptr);
}